

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O3

bool __thiscall
Fossilize::StateRecorder::Impl::copy_pipeline_layout
          (Impl *this,VkPipelineLayoutCreateInfo *create_info,ScratchAllocator *alloc,
          VkPipelineLayoutCreateInfo **out_create_info)

{
  void *pvVar1;
  VkPushConstantRange *pVVar2;
  VkDescriptorSetLayout *ppVVar3;
  void *pvVar4;
  undefined4 uVar5;
  VkPipelineLayoutCreateFlags VVar6;
  uint32_t uVar7;
  VkStructureType VVar8;
  undefined4 uVar9;
  VkPipelineLayoutCreateInfo *pVVar10;
  VkPushConstantRange *__dest;
  VkDescriptorSetLayout *__dest_00;
  size_t sVar11;
  
  pvVar1 = create_info->pNext;
  if (pvVar1 != (void *)0x0) goto LAB_0012b2cc;
  pVVar10 = (VkPipelineLayoutCreateInfo *)ScratchAllocator::allocate_raw(alloc,0x30,0x10);
  if (pVVar10 != (VkPipelineLayoutCreateInfo *)0x0) {
    VVar8 = create_info->sType;
    uVar9 = *(undefined4 *)&create_info->field_0x4;
    pvVar4 = create_info->pNext;
    VVar6 = create_info->flags;
    uVar7 = create_info->setLayoutCount;
    ppVVar3 = create_info->pSetLayouts;
    uVar5 = *(undefined4 *)&create_info->field_0x24;
    pVVar2 = create_info->pPushConstantRanges;
    pVVar10->pushConstantRangeCount = create_info->pushConstantRangeCount;
    *(undefined4 *)&pVVar10->field_0x24 = uVar5;
    pVVar10->pPushConstantRanges = pVVar2;
    pVVar10->flags = VVar6;
    pVVar10->setLayoutCount = uVar7;
    pVVar10->pSetLayouts = ppVVar3;
    pVVar10->sType = VVar8;
    *(undefined4 *)&pVVar10->field_0x4 = uVar9;
    pVVar10->pNext = pvVar4;
  }
  if ((ulong)pVVar10->pushConstantRangeCount == 0) {
LAB_0012b282:
    __dest = (VkPushConstantRange *)0x0;
  }
  else {
    pVVar2 = pVVar10->pPushConstantRanges;
    sVar11 = (ulong)pVVar10->pushConstantRangeCount * 0xc;
    __dest = (VkPushConstantRange *)ScratchAllocator::allocate_raw(alloc,sVar11,0x10);
    if (__dest == (VkPushConstantRange *)0x0) goto LAB_0012b282;
    memmove(__dest,pVVar2,sVar11);
  }
  pVVar10->pPushConstantRanges = __dest;
  if ((ulong)pVVar10->setLayoutCount == 0) {
LAB_0012b2c2:
    __dest_00 = (VkDescriptorSetLayout *)0x0;
  }
  else {
    ppVVar3 = pVVar10->pSetLayouts;
    sVar11 = (ulong)pVVar10->setLayoutCount << 3;
    __dest_00 = (VkDescriptorSetLayout *)ScratchAllocator::allocate_raw(alloc,sVar11,0x10);
    if (__dest_00 == (VkDescriptorSetLayout *)0x0) goto LAB_0012b2c2;
    memmove(__dest_00,ppVVar3,sVar11);
  }
  pVVar10->pSetLayouts = __dest_00;
  *out_create_info = pVVar10;
LAB_0012b2cc:
  return pvVar1 == (void *)0x0;
}

Assistant:

bool StateRecorder::Impl::copy_pipeline_layout(const VkPipelineLayoutCreateInfo *create_info, ScratchAllocator &alloc,
                                               VkPipelineLayoutCreateInfo **out_create_info)
{
	if (create_info->pNext)
		return false;

	auto *info = copy(create_info, 1, alloc);
	info->pPushConstantRanges = copy(info->pPushConstantRanges, info->pushConstantRangeCount, alloc);
	info->pSetLayouts = copy(info->pSetLayouts, info->setLayoutCount, alloc);

	*out_create_info = info;
	return true;
}